

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnectionChannel::detectPipeliningSupport(QHttpNetworkConnectionChannel *this)

{
  long *plVar1;
  Data *pDVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  SocketState SVar6;
  undefined4 uVar7;
  qsizetype qVar8;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QByteArrayView bv_00;
  QByteArrayView bv_01;
  QByteArrayView bv_02;
  QByteArrayView bv_03;
  QArrayDataPointer<char> local_88;
  QArrayDataPointer<char> local_68;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (char *)0x0;
  iVar5 = (**(code **)(**(long **)(this + 0x38) + 0x70))();
  if (iVar5 == 1) {
    iVar5 = (**(code **)(**(long **)(this + 0x38) + 0x78))();
    if (iVar5 == 1) {
      bVar4 = QHttpNetworkReplyPrivate::isConnectionCloseEnabled
                        (*(QHttpNetworkReplyPrivate **)(*(long *)(this + 0x38) + 8));
      if (!bVar4) {
        SVar6 = QSocketAbstraction::socketState(*(QIODevice **)(this + 0x10));
        if (SVar6 == ConnectedState) {
          plVar1 = *(long **)(this + 0x38);
          qVar8 = QByteArrayView::lengthHelperCharArray("Server",7);
          local_88.d = (Data *)0x0;
          local_88.ptr = (char *)0x0;
          local_88.size = 0;
          (**(code **)(*plVar1 + 0x98))(&local_68,plVar1,qVar8,"Server");
          qVar8 = local_48.size;
          pcVar3 = local_48.ptr;
          pDVar2 = local_48.d;
          local_48.d = local_68.d;
          local_48.ptr = local_68.ptr;
          local_68.d = pDVar2;
          local_68.ptr = pcVar3;
          local_48.size = local_68.size;
          local_68.size = qVar8;
          qVar8 = QByteArrayView::lengthHelperCharArray("Microsoft-IIS/4.",0x11);
          bv.m_data = "Microsoft-IIS/4.";
          bv.m_size = qVar8;
          bVar4 = QByteArray::contains((QByteArray *)&local_48,bv);
          if (!bVar4) {
            qVar8 = QByteArrayView::lengthHelperCharArray("Microsoft-IIS/5.",0x11);
            bv_00.m_data = "Microsoft-IIS/5.";
            bv_00.m_size = qVar8;
            bVar4 = QByteArray::contains((QByteArray *)&local_48,bv_00);
            if (!bVar4) {
              qVar8 = QByteArrayView::lengthHelperCharArray("Netscape-Enterprise/3.",0x17);
              bv_01.m_data = "Netscape-Enterprise/3.";
              bv_01.m_size = qVar8;
              bVar4 = QByteArray::contains((QByteArray *)&local_48,bv_01);
              if (!bVar4) {
                qVar8 = QByteArrayView::lengthHelperCharArray("WebLogic",9);
                bv_02.m_data = "WebLogic";
                bv_02.m_size = qVar8;
                bVar4 = QByteArray::contains((QByteArray *)&local_48,bv_02);
                if (!bVar4) {
                  qVar8 = QByteArrayView::lengthHelperCharArray("Rocket",7);
                  bv_03.m_data = "Rocket";
                  bv_03.m_size = qVar8;
                  bVar4 = QByteArray::startsWith((QByteArray *)&local_48,bv_03);
                  QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
                  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
                  if (!bVar4) {
                    uVar7 = 1;
                    goto LAB_001f1145;
                  }
                  goto LAB_001f1143;
                }
              }
            }
          }
          QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
        }
      }
    }
  }
LAB_001f1143:
  uVar7 = 0;
LAB_001f1145:
  *(undefined4 *)(this + 0xb0) = uVar7;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::detectPipeliningSupport()
{
    Q_ASSERT(reply);
    // detect HTTP Pipelining support
    QByteArray serverHeaderField;
    if (
            // check for HTTP/1.1
            (reply->majorVersion() == 1 && reply->minorVersion() == 1)
            // check for not having connection close
            && (!reply->d_func()->isConnectionCloseEnabled())
            // check if it is still connected
            && (QSocketAbstraction::socketState(socket) == QAbstractSocket::ConnectedState)
            // check for broken servers in server reply header
            // this is adapted from http://mxr.mozilla.org/firefox/ident?i=SupportsPipelining
            && (serverHeaderField = reply->headerField("Server"), !serverHeaderField.contains("Microsoft-IIS/4."))
            && (!serverHeaderField.contains("Microsoft-IIS/5."))
            && (!serverHeaderField.contains("Netscape-Enterprise/3."))
            // this is adpoted from the knowledge of the Nokia 7.x browser team (DEF143319)
            && (!serverHeaderField.contains("WebLogic"))
            && (!serverHeaderField.startsWith("Rocket")) // a Python Web Server, see Web2py.com
            ) {
        pipeliningSupported = QHttpNetworkConnectionChannel::PipeliningProbablySupported;
    } else {
        pipeliningSupported = QHttpNetworkConnectionChannel::PipeliningSupportUnknown;
    }
}